

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError AlsaRestart(PaAlsaStream *stream)

{
  PaError result;
  int in_stack_0000002c;
  PaAlsaStream *in_stack_00000030;
  uint in_stack_fffffffffffffff0;
  PaError PVar1;
  
  PVar1 = 0;
  paUtilErr_ = PaUnixMutex_Lock((PaUnixMutex *)(ulong)in_stack_fffffffffffffff0);
  if (paUtilErr_ < 0) {
    PaUtil_DebugPrint(
                     "Expression \'PaUnixMutex_Lock( &stream->stateMtx )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3239\n"
                     );
    PVar1 = paUtilErr_;
  }
  else {
    paUtilErr_ = AlsaStop(stream,result);
    if (paUtilErr_ < 0) {
      PaUtil_DebugPrint(
                       "Expression \'AlsaStop( stream, 0 )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3240\n"
                       );
      PVar1 = paUtilErr_;
    }
    else {
      paUtilErr_ = AlsaStart(in_stack_00000030,in_stack_0000002c);
      if (paUtilErr_ < 0) {
        PaUtil_DebugPrint(
                         "Expression \'AlsaStart( stream, 0 )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3241\n"
                         );
        PVar1 = paUtilErr_;
      }
    }
  }
  while( true ) {
    paUtilErr_ = PaUnixMutex_Unlock((PaUnixMutex *)CONCAT44(PVar1,in_stack_fffffffffffffff0));
    if (-1 < paUtilErr_) break;
    PaUtil_DebugPrint(
                     "Expression \'PaUnixMutex_Unlock( &stream->stateMtx )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3246\n"
                     );
    PVar1 = paUtilErr_;
  }
  return PVar1;
}

Assistant:

static PaError AlsaRestart( PaAlsaStream *stream )
{
    PaError result = paNoError;

    PA_ENSURE( PaUnixMutex_Lock( &stream->stateMtx ) );
    PA_ENSURE( AlsaStop( stream, 0 ) );
    PA_ENSURE( AlsaStart( stream, 0 ) );

    PA_DEBUG(( "%s: Restarted audio\n", __FUNCTION__ ));

error:
    PA_ENSURE( PaUnixMutex_Unlock( &stream->stateMtx ) );

    return result;
}